

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apriltag.c
# Opt level: O0

void apriltag_detector_destroy(apriltag_detector_t *td)

{
  apriltag_detector_t *td_local;
  
  timeprofile_destroy(td->tp);
  workerpool_destroy(td->wp);
  apriltag_detector_clear_families(td);
  zarray_destroy(td->tag_families);
  free(td);
  return;
}

Assistant:

void apriltag_detector_destroy(apriltag_detector_t *td)
{
    timeprofile_destroy(td->tp);
    workerpool_destroy(td->wp);

    apriltag_detector_clear_families(td);

    zarray_destroy(td->tag_families);
    free(td);
}